

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

int sexp_check_type(sexp_conflict ctx,sexp_conflict a,sexp_conflict b)

{
  int *piVar1;
  int iVar2;
  bool local_39;
  sexp_conflict v;
  sexp_conflict t;
  int d;
  sexp_conflict b_local;
  sexp_conflict a_local;
  sexp_conflict ctx_local;
  uint local_4;
  
  if (((ulong)a & 3) == 0) {
    if ((((((ulong)a & 3) == 0) && (((ulong)b & 3) == 0)) && (b->tag == 1)) &&
       (a->tag == (b->value).type.tag)) {
      local_4 = 1;
    }
    else {
      piVar1 = *(int **)(*(long *)((long)&((((ctx->value).type.setters)->value).type.getters)->value
                                  + (ulong)a->tag * 8 + 8) + 0x10);
      if ((((ulong)piVar1 & 3) == 0) && (*piVar1 == 10)) {
        if (b == (sexp_conflict)((((ctx->value).type.setters)->value).port.stream)->_IO_read_end) {
          local_4 = 1;
        }
        else {
          iVar2 = (int)(b->value).type.depth;
          local_39 = false;
          if (iVar2 < (int)*(undefined8 *)(piVar1 + 2)) {
            local_39 = *(sexp_conflict *)(piVar1 + (((long)iVar2 << 1) / 2) * 2 + 4) == b;
          }
          local_4 = (uint)local_39;
        }
      }
      else {
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int sexp_check_type(sexp ctx, sexp a, sexp b) {
  int d;
  sexp t, v;
  if (! sexp_pointerp(a))
    return 0;
  if (sexp_isa(a, b))
    return 1;
  t = sexp_object_type(ctx, a);
  v = sexp_type_cpl(t);
  if (! sexp_vectorp(v))
    return 0;
  if (b == sexp_type_by_index(ctx, SEXP_OBJECT))
    return 1;
  d = sexp_type_depth(b);
  return (d < (int)sexp_vector_length(v))
    && sexp_vector_ref(v, sexp_make_fixnum(d)) == b;
}